

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

ssize_t __thiscall
fmt::v7::detail::
arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
::write(arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
        *this,int __fd,void *__buf,size_t __n)

{
  char *pcVar1;
  ssize_t extraout_RAX;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar2;
  basic_string_view<char> s;
  
  if (this->specs_ != (format_specs *)0x0) {
    pcVar1 = "false";
    if (SUB41(__fd,0) != false) {
      pcVar1 = "true";
    }
    s.size_ = (ulong)(uint)__fd & 0xff ^ 5;
    s.data_ = pcVar1;
    write<char>(this,s,this->specs_);
    return extraout_RAX;
  }
  bVar2 = write<char,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
                    ((this->out_).container,SUB41(__fd,0));
  (this->out_).container = bVar2.container;
  return (ssize_t)bVar2.container;
}

Assistant:

void write(bool value) {
    if (specs_)
      write(string_view(value ? "true" : "false"), *specs_);
    else
      out_ = detail::write<Char>(out_, value);
  }